

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O3

void __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::thread_pool_implementation::task_state_type>::
deallocate_array(memory_manager_stateless_kernel_1<dlib::thread_pool_implementation::task_state_type>
                 *this,task_state_type *item)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  
  if (item != (task_state_type *)0x0) {
    lVar1 = *(long *)&item[-1].field_0x198;
    if (lVar1 != 0) {
      lVar2 = lVar1 * 0x1a0;
      do {
        if (*(long *)((long)&item[-1].eptr._M_exception_object + lVar2) != 0) {
          std::__exception_ptr::exception_ptr::_M_release();
        }
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)item + lVar2 + -0x18);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        (**(code **)**(undefined8 **)((long)item + lVar2 + -0x30))();
        (**(code **)**(undefined8 **)((long)item + lVar2 + -0xc0))();
        (**(code **)**(undefined8 **)((long)item + lVar2 + -0x100))();
        (**(code **)**(undefined8 **)((long)item + lVar2 + -0x140))();
        lVar2 = lVar2 + -0x1a0;
      } while (lVar2 != 0);
    }
    operator_delete__(&item[-1].eptr,lVar1 * 0x1a0 | 0x10);
    return;
  }
  return;
}

Assistant:

void deallocate_array (
                T* item
            ) 
            { 
                delete [] item;
            }